

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DispatchCompute
          (DeviceContextVkImpl *this,DispatchComputeAttribs *Attribs)

{
  DispatchComputeAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::DispatchCompute
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  PrepareForDispatchCompute(this);
  if (((Attribs->ThreadGroupCountX != 0) && (Attribs->ThreadGroupCountY != 0)) &&
     (Attribs->ThreadGroupCountZ != 0)) {
    VulkanUtilities::VulkanCommandBuffer::Dispatch
              (&this->m_CommandBuffer,Attribs->ThreadGroupCountX,Attribs->ThreadGroupCountY,
               Attribs->ThreadGroupCountZ);
    (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DispatchCompute(const DispatchComputeAttribs& Attribs)
{
    TDeviceContextBase::DispatchCompute(Attribs, 0);

    PrepareForDispatchCompute();

    if (Attribs.ThreadGroupCountX > 0 && Attribs.ThreadGroupCountY > 0 && Attribs.ThreadGroupCountZ > 0)
    {
        m_CommandBuffer.Dispatch(Attribs.ThreadGroupCountX, Attribs.ThreadGroupCountY, Attribs.ThreadGroupCountZ);
        ++m_State.NumCommands;
    }
}